

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unigram_model.cc
# Opt level: O3

vector<float,_std::allocator<float>_> * __thiscall
sentencepiece::unigram::Lattice::BackwardAlgorithm
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,Lattice *this,
          float inv_theta)

{
  float fVar1;
  pointer pvVar2;
  pointer ppNVar3;
  Node *pNVar4;
  Node *pNVar5;
  pointer pfVar6;
  uint uVar7;
  ulong uVar8;
  pointer ppNVar9;
  pointer ppNVar10;
  float fVar11;
  double dVar12;
  float fVar13;
  allocator_type local_59;
  vector<float,_std::allocator<float>_> *local_58;
  ulong local_50;
  pointer local_48;
  double local_40;
  value_type_conflict5 local_34;
  
  uVar7 = (int)((ulong)((long)(this->surface_).
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->surface_).
                             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 3) - 1;
  if ((int)uVar7 < 1) {
    uVar7 = 0;
  }
  uVar8 = (ulong)uVar7;
  local_34 = 0.0;
  local_58 = __return_storage_ptr__;
  std::vector<float,_std::allocator<float>_>::vector
            (__return_storage_ptr__,
             (this->node_allocator_).chunk_index_ * (this->node_allocator_).chunk_size_ +
             (this->node_allocator_).element_index_,&local_34,&local_59);
  do {
    pvVar2 = (this->end_nodes_).
             super__Vector_base<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_std::allocator<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppNVar9 = pvVar2[uVar8].
              super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_48 = *(pointer *)
                ((long)&pvVar2[uVar8].
                        super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                        ._M_impl.super__Vector_impl_data + 8);
    local_50 = uVar8;
    if (ppNVar9 != local_48) {
      do {
        pvVar2 = (this->begin_nodes_).
                 super__Vector_base<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_std::allocator<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ppNVar10 = pvVar2[uVar8].
                   super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppNVar3 = *(pointer *)
                   ((long)&pvVar2[uVar8].
                           super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                           ._M_impl.super__Vector_impl_data + 8);
        if (ppNVar10 != ppNVar3) {
          pNVar4 = *ppNVar9;
          pfVar6 = (local_58->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar7 = pNVar4->node_id;
          do {
            pNVar5 = *ppNVar10;
            fVar11 = pNVar5->score + pfVar6[pNVar5->node_id];
            if (pNVar5 != (Node *)**(long **)&(this->begin_nodes_).
                                              super__Vector_base<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_std::allocator<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[uVar8].
                                              super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                                              ._M_impl.super__Vector_impl_data) {
              fVar1 = pfVar6[uVar7];
              fVar13 = fVar11;
              if (fVar1 <= fVar11) {
                fVar13 = fVar1;
              }
              if (fVar11 <= fVar1) {
                fVar11 = fVar1;
              }
              if (fVar11 <= fVar13 + 50.0) {
                local_40 = (double)fVar11;
                dVar12 = exp((double)(fVar13 - fVar11));
                dVar12 = log(dVar12 + 1.0);
                fVar11 = (float)(dVar12 + local_40);
                uVar7 = pNVar4->node_id;
                pfVar6 = (local_58->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                         super__Vector_impl_data._M_start;
              }
            }
            pfVar6[uVar7] = fVar11;
            ppNVar10 = ppNVar10 + 1;
          } while (ppNVar10 != ppNVar3);
        }
        ppNVar9 = ppNVar9 + 1;
      } while (ppNVar9 != local_48);
    }
    uVar8 = local_50 - 1;
  } while (0 < (long)local_50);
  return local_58;
}

Assistant:

std::vector<float> Lattice::BackwardAlgorithm(float inv_theta) const {
  const int len = size();
  std::vector<float> beta(node_allocator_.size(), 0.0);

  for (int pos = len; pos >= 0; --pos) {
    for (Node *lnode : end_nodes_[pos]) {
      for (Node *rnode : begin_nodes_[pos]) {
        beta[lnode->node_id] =
            LogSumExp(beta[lnode->node_id], rnode->score + beta[rnode->node_id],
                      rnode == begin_nodes_[pos][0]);
      }
    }
  }

  return beta;
}